

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O1

void gradtrans(double *raw,int p,int q,int P,int Q,int M,double *A)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  double *pdVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  double local_9d8;
  double w2 [100];
  double w3 [100];
  double w1 [100];
  
  iVar2 = q + p;
  iVar3 = iVar2 + P;
  uVar9 = M + iVar3 + Q;
  if (uVar9 != 0 && SCARRY4(M,iVar3 + Q) == (int)uVar9 < 0) {
    uVar5 = (ulong)uVar9;
    uVar7 = 0;
    pdVar8 = A;
    do {
      uVar10 = 0;
      pdVar6 = pdVar8;
      do {
        if (uVar7 == uVar10) {
          *pdVar6 = (double)(int)uVar7;
        }
        uVar10 = uVar10 + 1;
        pdVar6 = pdVar6 + uVar5;
      } while (uVar10 < uVar5);
      uVar7 = uVar7 + 1;
      pdVar8 = pdVar8 + 1;
    } while (uVar7 < uVar5);
  }
  if (0 < p) {
    uVar5 = (ulong)(uint)p;
    memcpy(w3 + 99,raw,uVar5 * 8);
    artrans(p,w3 + 99,&local_9d8);
    uVar7 = 0;
    pdVar8 = A;
    do {
      dVar1 = w3[uVar7 + 99];
      w3[uVar7 + 99] = dVar1 + 0.001;
      artrans(p,w3 + 99,w2 + 99);
      uVar10 = 0;
      pdVar6 = pdVar8;
      do {
        *pdVar6 = (w2[uVar10 + 99] - w2[uVar10 - 1]) / 0.001;
        uVar10 = uVar10 + 1;
        pdVar6 = pdVar6 + (int)uVar9;
      } while (uVar5 != uVar10);
      w3[uVar7 + 99] = dVar1 + 0.001 + -0.001;
      uVar7 = uVar7 + 1;
      pdVar8 = pdVar8 + 1;
    } while (uVar7 != uVar5);
  }
  if (0 < q) {
    uVar5 = (ulong)(uint)q;
    memcpy(w3 + 99,raw + p,uVar5 * 8);
    artrans(q,w3 + 99,&local_9d8);
    uVar7 = 0;
    iVar11 = p;
    do {
      dVar1 = w3[uVar7 + 99];
      w3[uVar7 + 99] = dVar1 + 0.001;
      artrans(q,w3 + 99,w2 + 99);
      uVar10 = 0;
      iVar4 = iVar11;
      do {
        A[iVar4] = (w2[uVar10 + 99] - w2[uVar10 - 1]) / 0.001;
        uVar10 = uVar10 + 1;
        iVar4 = iVar4 + uVar9;
      } while (uVar5 != uVar10);
      w3[uVar7 + 99] = dVar1 + 0.001 + -0.001;
      uVar7 = uVar7 + 1;
      iVar11 = iVar11 + 1;
    } while (uVar7 != uVar5);
  }
  if (0 < P) {
    uVar5 = (ulong)(uint)P;
    memcpy(w3 + 99,raw + iVar2,uVar5 * 8);
    artrans(P,w3 + 99,&local_9d8);
    iVar2 = uVar9 * iVar2 + iVar2;
    uVar7 = 0;
    do {
      dVar1 = w3[uVar7 + 99];
      w3[uVar7 + 99] = dVar1 + 0.001;
      artrans(P,w3 + 99,w2 + 99);
      uVar10 = 0;
      iVar11 = iVar2;
      do {
        A[iVar11] = (w2[uVar10 + 99] - w2[uVar10 - 1]) / 0.001;
        uVar10 = uVar10 + 1;
        iVar11 = iVar11 + uVar9;
      } while (uVar5 != uVar10);
      w3[uVar7 + 99] = dVar1 + 0.001 + -0.001;
      uVar7 = uVar7 + 1;
      iVar2 = iVar2 + 1;
    } while (uVar7 != uVar5);
  }
  if (0 < Q) {
    uVar5 = (ulong)(uint)Q;
    memcpy(w3 + 99,raw + iVar3,uVar5 * 8);
    artrans(Q,w3 + 99,&local_9d8);
    iVar2 = iVar3 * uVar9 + P + q + p;
    uVar7 = 0;
    do {
      dVar1 = w3[uVar7 + 99];
      w3[uVar7 + 99] = dVar1 + 0.001;
      artrans(Q,w3 + 99,w2 + 99);
      uVar10 = 0;
      iVar3 = iVar2;
      do {
        A[iVar3] = (w2[uVar10 + 99] - w2[uVar10 - 1]) / 0.001;
        uVar10 = uVar10 + 1;
        iVar3 = iVar3 + uVar9;
      } while (uVar5 != uVar10);
      w3[uVar7 + 99] = dVar1 + 0.001 + -0.001;
      uVar7 = uVar7 + 1;
      iVar2 = iVar2 + 1;
    } while (uVar7 != uVar5);
  }
  return;
}

Assistant:

void gradtrans(double *raw, int p, int q, int P, int Q,int M, double *A) {
	int i, j, v, N;
	double w1[100], w2[100], w3[100];
	double eps = 1e-03;
	N = p + q + P + Q + M;

	for (i = 0; i < N; ++i) {
		for (j = 0; j < N; ++j) {
			if (i == j) {
				A[i + j*N] = (double)i;
			}
		}
	}

	if (p > 0) {
		memcpy(w1, raw, sizeof(double)*p);
		artrans(p, w1, w2);

		for (i = 0; i < p; ++i) {
			w1[i] += eps;
			artrans(p, w1, w3);
			for (j = 0; j < p; ++j) {
				A[i + j*N] = (w3[j] - w2[j]) / eps;
			}
			w1[i] -= eps;
		}
	}

	if (q > 0) {
		v = p;
		memcpy(w1, raw+v, sizeof(double)*q);
		artrans(q, w1, w2);

		for (i = 0; i < q; ++i) {
			w1[i] += eps;
			artrans(q, w1, w3);
			for (j = 0; j < q; ++j) {
				A[i + j*N + v] = (w3[j] - w2[j]) / eps;
			}
			w1[i] -= eps;
		}
	}

	if (P > 0) {
		v = p + q;
		memcpy(w1, raw + v, sizeof(double)*P);
		artrans(P, w1, w2);

		for (i = 0; i < P; ++i) {
			w1[i] += eps;
			artrans(P, w1, w3);
			for (j = 0; j < P; ++j) {
				A[i + (j + v)*N + v] = (w3[j] - w2[j]) / eps;
			}
			w1[i] -= eps;
		}
	}

	if (Q > 0) {
		v = p + q + P;
		memcpy(w1, raw + v, sizeof(double)*Q);
		artrans(Q, w1, w2);

		for (i = 0; i < Q; ++i) {
			w1[i] += eps;
			artrans(Q, w1, w3);
			for (j = 0; j < Q; ++j) {
				A[i + (j + v)*N + v] = (w3[j] - w2[j]) / eps;
			}
			w1[i] -= eps;
		}
	}
}